

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::NumberStringBuilder::getAllFieldPositions
          (NumberStringBuilder *this,FieldPositionIteratorHandler *fpih,UErrorCode *status)

{
  UNumberFormatFields UVar1;
  bool bVar2;
  ValueOrHeapArray<UNumberFormatFields> *pVVar3;
  UNumberFormatFields UVar4;
  ulong uVar5;
  ulong uVar6;
  uint local_3c;
  
  bVar2 = 0 < this->fLength;
  if (this->fLength < 1) {
    uVar5 = 0xb;
    local_3c = 0xffffffff;
  }
  else {
    local_3c = 0xffffffff;
    uVar5 = 0xb;
    uVar6 = 0;
    do {
      pVVar3 = &this->fFields;
      if (this->fUsingHeap != false) {
        pVVar3 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      }
      UVar1 = pVVar3->value[(long)this->fZero + uVar6];
      UVar4 = (UNumberFormatFields)uVar5;
      if (UVar1 == UNUM_GROUPING_SEPARATOR_FIELD && UVar4 == UNUM_INTEGER_FIELD) {
        (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                  (fpih,6,uVar6 & 0xffffffff,(ulong)((uint)uVar6 + 1));
        uVar5 = 0;
      }
      else if (UVar4 != UVar1) {
        if (UVar4 != UNUM_FIELD_COUNT) {
          (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                    (fpih,uVar5,(ulong)local_3c,uVar6 & 0xffffffff);
        }
        uVar5 = (ulong)UVar1;
        local_3c = (uint)uVar6;
      }
      if (U_ZERO_ERROR < *status) break;
      uVar6 = uVar6 + 1;
      bVar2 = (int)uVar6 < this->fLength;
    } while ((int)uVar6 < this->fLength);
  }
  if ((!bVar2) && ((int)uVar5 != 0xb)) {
    (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
              (fpih,uVar5,(ulong)local_3c,(ulong)(uint)this->fLength);
    return;
  }
  return;
}

Assistant:

void NumberStringBuilder::getAllFieldPositions(FieldPositionIteratorHandler& fpih,
                                               UErrorCode& status) const {
    Field current = UNUM_FIELD_COUNT;
    int32_t currentStart = -1;
    for (int32_t i = 0; i < fLength; i++) {
        Field field = fieldAt(i);
        if (current == UNUM_INTEGER_FIELD && field == UNUM_GROUPING_SEPARATOR_FIELD) {
            // Special case: GROUPING_SEPARATOR counts as an INTEGER.
            fpih.addAttribute(UNUM_GROUPING_SEPARATOR_FIELD, i, i + 1);
        } else if (current != field) {
            if (current != UNUM_FIELD_COUNT) {
                fpih.addAttribute(current, currentStart, i);
            }
            current = field;
            currentStart = i;
        }
        if (U_FAILURE(status)) {
            return;
        }
    }
    if (current != UNUM_FIELD_COUNT) {
        fpih.addAttribute(current, currentStart, fLength);
    }
}